

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe_method.cpp
# Opt level: O0

ostream * operator<<(ostream *out,RNG *rng)

{
  ostream *poVar1;
  int64_t iVar2;
  Mark local_e8;
  Mark local_a8;
  Mark local_58;
  RNG *local_18;
  RNG *rng_local;
  ostream *out_local;
  
  local_18 = rng;
  rng_local = (RNG *)out;
  poVar1 = std::operator<<(out,"Generated ");
  iVar2 = bm::Mark::iterations(&local_18->_generate_mark);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  poVar1 = std::operator<<(poVar1," numbers:\n");
  poVar1 = std::operator<<(poVar1,"Total time = ");
  iVar2 = bm::Mark::as_nanoseconds(&local_18->_generate_mark);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  poVar1 = std::operator<<(poVar1,"ns\n");
  poVar1 = std::operator<<(poVar1,"Average time = ");
  bm::Mark::average(&local_58,&local_18->_generate_mark);
  iVar2 = bm::Mark::as_nanoseconds(&local_58);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  poVar1 = std::operator<<(poVar1,"ns\n");
  poVar1 = std::operator<<(poVar1,"Max time = ");
  bm::Mark::maximal(&local_a8,&local_18->_generate_mark);
  iVar2 = bm::Mark::as_nanoseconds(&local_a8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  poVar1 = std::operator<<(poVar1,"ns\n");
  poVar1 = std::operator<<(poVar1,"Min time = ");
  bm::Mark::minimal(&local_e8,&local_18->_generate_mark);
  iVar2 = bm::Mark::as_nanoseconds(&local_e8);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  std::operator<<(poVar1,"ns\n");
  bm::Mark::~Mark(&local_e8);
  bm::Mark::~Mark(&local_a8);
  bm::Mark::~Mark(&local_58);
  return (ostream *)rng_local;
}

Assistant:

inline std::ostream& operator<<(std::ostream& out, RNG& rng)
{
    out << "Generated " << rng._generate_mark.iterations() << " numbers:\n"
        << "Total time = " << rng._generate_mark.as_nanoseconds() << "ns\n"
        << "Average time = " << rng._generate_mark.average().as_nanoseconds() << "ns\n"
        << "Max time = " << rng._generate_mark.maximal().as_nanoseconds() << "ns\n"
        << "Min time = " << rng._generate_mark.minimal().as_nanoseconds() << "ns\n";
    return out;
}